

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O3

void __thiscall QComboBox::insertItems(QComboBox *this,int index,QStringList *list)

{
  QPersistentModelIndex *this_00;
  QComboBoxPrivate *this_01;
  QAbstractItemModel *pQVar1;
  long *plVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  P _b;
  long lVar7;
  QArrayData *this_02;
  P _a;
  ulong uVar8;
  ulong uVar9;
  QList_conflict *pQVar10;
  QList_conflict *pQVar11;
  long in_FS_OFFSET;
  QModelIndex local_90;
  QArrayData *local_78;
  undefined8 uStack_70;
  qsizetype qStack_68;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((list->d).size != 0) {
    this_01 = *(QComboBoxPrivate **)&(this->super_QWidget).field_0x8;
    pQVar1 = this_01->model;
    this_00 = &this_01->root;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_58,this_00);
    uVar4 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&local_58);
    if ((int)uVar4 < index) {
      index = uVar4;
    }
    pQVar10 = (QList_conflict *)0x0;
    if (0 < index) {
      pQVar10 = (QList_conflict *)(ulong)(uint)index;
    }
    uVar8 = (long)this_01->maxCount - (long)pQVar10;
    uVar9 = (list->d).size;
    if ((long)uVar9 < (long)uVar8) {
      uVar8 = uVar9;
    }
    uVar4 = (uint)uVar8;
    if (0 < (int)uVar4) {
      lVar7 = QMetaObject::cast((QObject *)&QStandardItemModel::staticMetaObject);
      if (lVar7 == 0) {
        this_01->field_0x34c = this_01->field_0x34c | 8;
        pQVar1 = this_01->model;
        QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_58,this_00);
        cVar3 = (**(code **)(*(long *)pQVar1 + 0xf8))(pQVar1,pQVar10,uVar8 & 0xffffffff,&local_58);
        if (cVar3 == '\0') {
          this_01->field_0x34c = this_01->field_0x34c & 0xf7;
        }
        else {
          local_78 = (QArrayData *)0xffffffffffffffff;
          uStack_70 = 0;
          qStack_68 = 0;
          uVar9 = (ulong)(uVar4 & 0x7fffffff);
          lVar7 = 0;
          pQVar11 = pQVar10;
          do {
            pQVar1 = this_01->model;
            iVar5 = this_01->modelColumn;
            QPersistentModelIndex::operator_cast_to_QModelIndex(&local_90,this_00);
            (**(code **)(*(long *)pQVar1 + 0x60))(&local_58,pQVar1,pQVar11,iVar5,&local_90);
            qStack_68 = local_58._16_8_;
            local_78 = (QArrayData *)local_58.shared;
            uStack_70 = local_58._8_8_;
            pQVar1 = this_01->model;
            ::QVariant::QVariant
                      ((QVariant *)&local_58,(QString *)((long)&(((list->d).ptr)->d).d + lVar7));
            (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,&local_78,&local_58,2);
            ::QVariant::~QVariant((QVariant *)&local_58);
            pQVar11 = (QList_conflict *)(ulong)((int)pQVar11 + 1);
            lVar7 = lVar7 + 0x18;
            uVar9 = uVar9 - 1;
          } while (uVar9 != 0);
          this_01->field_0x34c = this_01->field_0x34c & 0xf7;
          QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_58,this_00);
          QComboBoxPrivate::rowsInserted
                    (this_01,(QModelIndex *)&local_58,(int)pQVar10,(int)pQVar10 + uVar4 + -1);
        }
      }
      else {
        local_58.shared = (PrivateShared *)0x0;
        local_58._8_8_ = 0;
        local_58._16_8_ = 0;
        uVar9 = (ulong)(uVar4 & 0x7fffffff);
        QList<QStandardItem_*>::reserve((QList<QStandardItem_*> *)&local_58,uVar9);
        iVar5 = QStandardItemModel::invisibleRootItem();
        lVar7 = 0;
        do {
          this_02 = (QArrayData *)operator_new(0x10);
          QStandardItem::QStandardItem
                    ((QStandardItem *)this_02,(QString *)((long)&(((list->d).ptr)->d).d + lVar7));
          local_78 = this_02;
          QtPrivate::QPodArrayOps<QStandardItem*>::emplace<QStandardItem*&>
                    ((QPodArrayOps<QStandardItem*> *)local_58.data,local_58._16_8_,
                     (QStandardItem **)&local_78);
          QList<QStandardItem_*>::end((QList<QStandardItem_*> *)&local_58);
          lVar7 = lVar7 + 0x18;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
        QStandardItem::insertRows(iVar5,pQVar10);
        if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_58.shared = *(int *)local_58.shared + -1;
          UNLOCK();
          if (*(int *)local_58.shared == 0) {
            QArrayData::deallocate((QArrayData *)local_58.shared,8,0x10);
          }
        }
      }
      lVar7 = *(long *)&(this->super_QWidget).field_0x8;
      plVar2 = *(long **)(lVar7 + 0x298);
      QPersistentModelIndex::operator_cast_to_QModelIndex
                ((QModelIndex *)&local_58,(QPersistentModelIndex *)(lVar7 + 0x2c0));
      iVar6 = (**(code **)(*plVar2 + 0x78))(plVar2,&local_58);
      iVar5 = this_01->maxCount;
      if (iVar6 - iVar5 != 0 && iVar5 <= iVar6) {
        pQVar1 = this_01->model;
        QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_58,this_00);
        (**(code **)(*(long *)pQVar1 + 0x108))(pQVar1,iVar5,iVar6 - iVar5,&local_58);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QComboBox::insertItems(int index, const QStringList &list)
{
    Q_D(QComboBox);
    if (list.isEmpty())
        return;
    index = qBound(0, index, count());
    int insertCount = qMin(d->maxCount - index, list.size());
    if (insertCount <= 0)
        return;
    // For the common case where we are using the built in QStandardItemModel
    // construct a QStandardItem, reducing the number of expensive signals from the model
    if (QStandardItemModel *m = qobject_cast<QStandardItemModel*>(d->model)) {
        QList<QStandardItem *> items;
        items.reserve(insertCount);
        QStandardItem *hiddenRoot = m->invisibleRootItem();
        for (int i = 0; i < insertCount; ++i)
            items.append(new QStandardItem(list.at(i)));
        hiddenRoot->insertRows(index, items);
    } else {
        d->inserting = true;
        if (d->model->insertRows(index, insertCount, d->root)) {
            QModelIndex item;
            for (int i = 0; i < insertCount; ++i) {
                item = d->model->index(i+index, d->modelColumn, d->root);
                d->model->setData(item, list.at(i), Qt::EditRole);
            }
            d->inserting = false;
            d->rowsInserted(d->root, index, index + insertCount - 1);
        } else {
            d->inserting = false;
        }
    }

    int mc = count();
    if (mc > d->maxCount)
        d->model->removeRows(d->maxCount, mc - d->maxCount, d->root);
}